

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O2

int property_list(char *path)

{
  ssize_t sVar1;
  int iVar2;
  char recvBuf [1];
  undefined1 local_19;
  
  pthread_once(&gInitOnce,init);
  iVar2 = -1;
  if (-1 < gPropFd) {
    local_19 = 3;
    pthread_mutex_lock((pthread_mutex_t *)&gPropertyFdLock);
    sVar1 = write(gPropFd,&local_19,1);
    if (sVar1 == 1) {
      sVar1 = read(gPropFd,recvBuf,1);
      pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
      if (sVar1 == 1) {
        builtin_strncpy(path,"/tmp/linux-sysprop-list",0x18);
        iVar2 = -(uint)(recvBuf[0] != '\x01');
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
    }
  }
  return iVar2;
}

Assistant:

int property_list(char *path)
{
    char sendBuf[1];
    char recvBuf[1];
	

    //LOGV("PROPERTY LIST\n");
    pthread_once(&gInitOnce, init);
    if (gPropFd < 0)
        return -1;

    memset(sendBuf, 0xdd, sizeof(sendBuf));    // placate valgrind

    sendBuf[0] = (char) kSystemPropertyList;

    pthread_mutex_lock(&gPropertyFdLock);
    if (write(gPropFd, sendBuf, sizeof(sendBuf)) != sizeof(sendBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    if (read(gPropFd, recvBuf, sizeof(recvBuf)) != sizeof(recvBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    pthread_mutex_unlock(&gPropertyFdLock);

	sprintf(path, "%s", SYSTEM_PROPERTY_LIST_NAME);

    if (recvBuf[0] != 1)
        return -1;
    return 0;
}